

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-records_fare_rules.c
# Opt level: O1

void CGTFS_RecordFareRule(void)

{
  int iVar1;
  fare_rule_t fr_1;
  char *field_values [5];
  char *field_names [5];
  fare_rule_t fStack_3e8;
  undefined1 local_2a8 [16];
  char *local_298;
  char *pcStack_290;
  char *local_288;
  undefined1 local_168 [16];
  char *local_158;
  char *pcStack_150;
  char *local_148;
  
  iVar1 = greatest_test_pre("fare_rule_read");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      local_148 = "contains_id";
      local_158 = "origin_id";
      pcStack_150 = "destination_id";
      local_168._0_8_ = "fare_id";
      local_168._8_8_ = "route_id";
      local_288 = "6";
      local_298 = "2";
      pcStack_290 = "8";
      local_2a8._0_8_ = "b";
      local_2a8._8_8_ = "TSW";
      read_fare_rule(&fStack_3e8,5,(char **)local_168,(char **)local_2a8);
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = greatest_do_assert_equal_t("b",&fStack_3e8,&greatest_type_info_string,(void *)0x0);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x14;
        if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
LAB_00120ba2:
          greatest_info.msg = "type_info->equal callback missing!";
        }
        else {
          greatest_info.msg = "\"b\" != fr_1.fare_id";
        }
      }
      else {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar1 = greatest_do_assert_equal_t
                          ("TSW",fStack_3e8.route_id,&greatest_type_info_string,(void *)0x0);
        if (iVar1 == 0) {
          greatest_info.fail_line = 0x15;
          if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_00120ba2;
          greatest_info.msg = "\"TSW\" != fr_1.route_id";
        }
        else {
          greatest_info.assertions = greatest_info.assertions + 1;
          iVar1 = greatest_do_assert_equal_t
                            ("2",fStack_3e8.origin_id,&greatest_type_info_string,(void *)0x0);
          if (iVar1 == 0) {
            greatest_info.fail_line = 0x16;
            if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_00120ba2;
            greatest_info.msg = "\"2\" != fr_1.origin_id";
          }
          else {
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar1 = greatest_do_assert_equal_t
                              ("8",fStack_3e8.destination_id,&greatest_type_info_string,(void *)0x0)
            ;
            if (iVar1 == 0) {
              greatest_info.fail_line = 0x17;
              if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_00120ba2;
              greatest_info.msg = "\"8\" != fr_1.destination_id";
            }
            else {
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar1 = greatest_do_assert_equal_t
                                ("6",fStack_3e8.contains_id,&greatest_type_info_string,(void *)0x0);
              if (iVar1 != 0) {
                greatest_info.msg = (char *)0x0;
                iVar1 = 0;
                goto LAB_00120bc4;
              }
              greatest_info.fail_line = 0x18;
              if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_00120ba2;
              greatest_info.msg = "\"6\" != fr_1.contains_id";
            }
          }
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_fare_rules.c"
      ;
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00120d28;
    }
LAB_00120bc4:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("fare_rule_compare");
  if (iVar1 == 0) {
    return;
  }
  iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
  if (iVar1 == 0) {
    memcpy(&fStack_3e8,"SOME_ID1",0x140);
    memcpy((fare_rule_t *)local_168,"SOME_ID1",0x140);
    memcpy(local_2a8,"SOME_ID2",0x140);
    greatest_info.assertions = greatest_info.assertions + 1;
    iVar1 = equal_fare_rule(&fStack_3e8,(fare_rule_t *)local_168);
    if (iVar1 == 1) {
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = equal_fare_rule(&fStack_3e8,(fare_rule_t *)local_2a8);
      if (iVar1 == 0) {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar1 = equal_fare_rule((fare_rule_t *)local_168,(fare_rule_t *)local_2a8);
        if (iVar1 == 0) {
          greatest_info.msg = (char *)0x0;
          iVar1 = 0;
          goto LAB_00120cc5;
        }
        greatest_info.fail_line = 0x38;
        greatest_info.msg = "0 != equal_fare_rule(&b, &c)";
      }
      else {
        greatest_info.fail_line = 0x37;
        greatest_info.msg = "0 != equal_fare_rule(&a, &c)";
      }
    }
    else {
      greatest_info.fail_line = 0x36;
      greatest_info.msg = "1 != equal_fare_rule(&a, &b)";
    }
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_fare_rules.c"
    ;
    iVar1 = -1;
    if ((greatest_info.flags & 4) != 0) {
LAB_00120d28:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_fare_rules.c"
      ;
      abort();
    }
  }
LAB_00120cc5:
  greatest_test_post(iVar1);
  return;
}

Assistant:

SUITE(CGTFS_RecordFareRule) {
    RUN_TEST(fare_rule_read);
    RUN_TEST(fare_rule_compare);
}